

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImStb::stb_textedit_discard_undo(StbUndoState *state)

{
  int iVar1;
  int local_18;
  int i;
  int n;
  StbUndoState *state_local;
  
  if (0 < state->undo_point) {
    if (-1 < state->undo_rec[0].char_storage) {
      iVar1 = state->undo_rec[0].insert_length;
      state->undo_char_point = state->undo_char_point - iVar1;
      memmove(state->undo_char,state->undo_char + iVar1,(long)state->undo_char_point << 1);
      for (local_18 = 0; local_18 < state->undo_point; local_18 = local_18 + 1) {
        if (-1 < state->undo_rec[local_18].char_storage) {
          state->undo_rec[local_18].char_storage = state->undo_rec[local_18].char_storage - iVar1;
        }
      }
    }
    state->undo_point = state->undo_point + -1;
    memmove(state,state->undo_rec + 1,(long)state->undo_point << 4);
  }
  return;
}

Assistant:

static void stb_textedit_discard_undo(StbUndoState *state)
{
   if (state->undo_point > 0) {
      // if the 0th undo state has characters, clean those up
      if (state->undo_rec[0].char_storage >= 0) {
         int n = state->undo_rec[0].insert_length, i;
         // delete n characters from all other records
         state->undo_char_point -= n;
         STB_TEXTEDIT_memmove(state->undo_char, state->undo_char + n, (size_t) (state->undo_char_point*sizeof(STB_TEXTEDIT_CHARTYPE)));
         for (i=0; i < state->undo_point; ++i)
            if (state->undo_rec[i].char_storage >= 0)
               state->undo_rec[i].char_storage -= n; // @OPTIMIZE: get rid of char_storage and infer it
      }
      --state->undo_point;
      STB_TEXTEDIT_memmove(state->undo_rec, state->undo_rec+1, (size_t) (state->undo_point*sizeof(state->undo_rec[0])));
   }
}